

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaNTests.cpp
# Opt level: O0

void __thiscall IsNotNaNTests::ThenIsNotNanXIsNotFalse<float>(IsNotNaNTests *this,float value)

{
  char *pcVar1;
  anon_class_4_1_a8c68091 local_164;
  function<void_()> local_160;
  allocator local_139;
  string local_138 [32];
  utility local_118 [39];
  allocator local_f1;
  string local_f0 [55];
  allocator local_b9;
  string local_b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [36];
  float local_14;
  IsNotNaNTests *pIStack_10;
  float value_local;
  IsNotNaNTests *this_local;
  
  local_14 = value;
  pIStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"Is::Not::NaN(",&local_b9);
  pcVar1 = std::type_info::name((type_info *)&float::typeinfo);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,pcVar1,&local_f1);
  std::operator+(local_98,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_b8);
  std::operator+(local_78,(char *)local_98);
  ut11::utility::ToString<float>(local_118,&local_14);
  std::operator+(local_58,local_78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_138,") is Not False",&local_139);
  std::operator+(local_38,local_58);
  local_164.value = local_14;
  std::function<void()>::
  function<IsNotNaNTests::ThenIsNotNanXIsNotFalse<float>(float)::_lambda()_1_,void>
            ((function<void()> *)&local_160,&local_164);
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,local_38,&local_160);
  std::function<void_()>::~function(&local_160);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)local_118);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  return;
}

Assistant:

void ThenIsNotNanXIsNotFalse(T value)
	{
		Then(std::string("Is::Not::NaN(") + std::string(typeid(T).name()) + ": " + ut11::utility::ToString(value) + std::string(") is Not False"), [value]() {
			AssertThat(ut11::Is::Not::NaN(value), ut11::Is::Not::False);
		});
	}